

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureMipmapTests.cpp
# Opt level: O1

int __thiscall
deqp::gles3::Functional::Texture3DMipmapCase::init(Texture3DMipmapCase *this,EVP_PKEY_CTX *ctx)

{
  pointer pPVar1;
  int i;
  int extraout_EAX;
  RenderTarget *pRVar2;
  Texture3D *this_00;
  long lVar3;
  NotSupportedError *this_01;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  deUint32 step;
  Vector<float,_4> res;
  TextureFormatInfo fmtInfo;
  string local_b8;
  float local_98 [4];
  TextureFormat local_88;
  RGBA local_80 [4];
  TextureFormatInfo local_70;
  
  local_88 = glu::mapGLInternalFormat(this->m_internalFormat);
  tcu::getTextureFormatInfo(&local_70,&local_88);
  uVar4 = this->m_height;
  if (this->m_height < this->m_width) {
    uVar4 = this->m_width;
  }
  if ((int)uVar4 <= this->m_depth) {
    uVar4 = this->m_depth;
  }
  if (uVar4 == 0) {
    uVar5 = 0x20;
  }
  else {
    uVar5 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    uVar5 = uVar5 ^ 0x1f;
  }
  if ((this->m_coordType == COORDTYPE_PROJECTED) &&
     (pRVar2 = Context::getRenderTarget((this->super_TestCase).m_context), 0 < pRVar2->m_numSamples)
     ) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"Projected lookup validation not supported in multisample config"
               ,"");
    tcu::NotSupportedError::NotSupportedError(this_01,&local_b8);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  this_00 = (Texture3D *)operator_new(0x70);
  glu::Texture3D::Texture3D
            (this_00,((this->super_TestCase).m_context)->m_renderCtx,this->m_internalFormat,
             this->m_width,this->m_height,this->m_depth);
  this->m_texture = this_00;
  if (uVar4 != 0) {
    iVar7 = 0x1f - uVar5;
    if (iVar7 < 1) {
      iVar7 = 0;
    }
    uVar6 = 0;
    do {
      tcu::Texture3D::allocLevel(&this->m_texture->m_refTexture,(int)uVar6);
      pPVar1 = (this->m_texture->m_refTexture).super_TextureLevelPyramid.m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      tcu::RGBA::toVec(local_80);
      local_98[0] = 0.0;
      local_98[1] = 0.0;
      local_98[2] = 0.0;
      local_98[3] = 0.0;
      lVar3 = 0;
      do {
        local_98[lVar3] = (float)local_80[lVar3].m_value * local_70.lookupScale.m_data[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      local_b8._M_dataplus._M_p = (pointer)0x0;
      local_b8._M_string_length = 0;
      lVar3 = 0;
      do {
        *(float *)((long)&local_b8._M_dataplus._M_p + lVar3 * 4) =
             local_98[lVar3] + local_70.lookupBias.m_data[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      tcu::clear(pPVar1 + uVar6,(Vec4 *)&local_b8);
      uVar6 = uVar6 + 1;
    } while (uVar6 != iVar7 + 1);
  }
  glu::Texture3D::upload(this->m_texture);
  return extraout_EAX;
}

Assistant:

void Texture3DMipmapCase::init (void)
{
	const tcu::TextureFormat&		texFmt			= glu::mapGLInternalFormat(m_internalFormat);
	tcu::TextureFormatInfo			fmtInfo			= tcu::getTextureFormatInfo(texFmt);
	const tcu::Vec4&				cScale			= fmtInfo.lookupScale;
	const tcu::Vec4&				cBias			= fmtInfo.lookupBias;
	int								numLevels		= deLog2Floor32(de::max(de::max(m_width, m_height), m_depth))+1;

	if (m_coordType == COORDTYPE_PROJECTED && m_context.getRenderTarget().getNumSamples() > 0)
		throw tcu::NotSupportedError("Projected lookup validation not supported in multisample config");

	m_texture = new glu::Texture3D(m_context.getRenderContext(), m_internalFormat, m_width, m_height, m_depth);

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		deUint32	step		= 0xff / (numLevels-1);
		deUint32	inc			= deClamp32(step*levelNdx, 0x00, 0xff);
		deUint32	dec			= 0xff - inc;
		deUint32	rgb			= (0xff << 16) | (dec << 8) | inc;
		deUint32	color		= 0xff000000 | rgb;

		m_texture->getRefTexture().allocLevel(levelNdx);
		tcu::clear(m_texture->getRefTexture().getLevel(levelNdx), tcu::RGBA(color).toVec()*cScale + cBias);
	}

	m_texture->upload();
}